

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

FArchive * operator<<(FArchive *arc,FLinePortal *port)

{
  FArchive *pFVar1;
  FLinePortal *port_local;
  FArchive *arc_local;
  
  pFVar1 = operator<<(arc,&port->mOrigin);
  pFVar1 = operator<<(pFVar1,&port->mDestination);
  pFVar1 = operator<<(pFVar1,&port->mDisplacement);
  pFVar1 = FArchive::operator<<(pFVar1,&port->mType);
  pFVar1 = FArchive::operator<<(pFVar1,&port->mFlags);
  pFVar1 = FArchive::operator<<(pFVar1,&port->mDefFlags);
  FArchive::operator<<(pFVar1,&port->mAlign);
  return arc;
}

Assistant:

FArchive &operator<< (FArchive &arc, FLinePortal &port)
{
	arc << port.mOrigin
		<< port.mDestination
		<< port.mDisplacement
		<< port.mType
		<< port.mFlags
		<< port.mDefFlags
		<< port.mAlign;
	return arc;
}